

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int rtreeSavepoint(sqlite3_vtab *pVtab,int iSavepoint)

{
  undefined1 uVar1;
  
  uVar1 = *(undefined1 *)&pVtab[1].zErrMsg;
  *(undefined1 *)&pVtab[1].zErrMsg = 0;
  nodeBlobReset((Rtree *)pVtab);
  *(undefined1 *)&pVtab[1].zErrMsg = uVar1;
  return 0;
}

Assistant:

static int rtreeSavepoint(sqlite3_vtab *pVtab, int iSavepoint){
  Rtree *pRtree = (Rtree *)pVtab;
  u8 iwt = pRtree->inWrTrans;
  UNUSED_PARAMETER(iSavepoint);
  pRtree->inWrTrans = 0;
  nodeBlobReset(pRtree);
  pRtree->inWrTrans = iwt;
  return SQLITE_OK;
}